

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# equality.cpp
# Opt level: O2

void __thiscall
Equality_importSourceNotEqualImportSourceReference_Test::
Equality_importSourceNotEqualImportSourceReference_Test
          (Equality_importSourceNotEqualImportSourceReference_Test *this)

{
  testing::Test::Test(&this->super_Test);
  *(undefined ***)this = &PTR__Test_0012e740;
  return;
}

Assistant:

TEST(Equality, importSourceNotEqualImportSourceReference)
{
    libcellml::ComponentPtr c1 = libcellml::Component::create("bob");
    libcellml::ComponentPtr c2 = libcellml::Component::create("bob");

    libcellml::ImportSourcePtr is1 = libcellml::ImportSource::create();
    is1->setUrl("a_great_url");

    libcellml::ImportSourcePtr is2 = libcellml::ImportSource::create();
    is2->setUrl("a_better_url");

    c1->setImportSource(is1);
    c1->setImportReference("dave");

    c2->setImportSource(is2);

    EXPECT_FALSE(c1->equals(c2));
}